

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb_sse4.c
# Opt level: O0

void av1_txb_init_levels_sse4_1(tran_low_t *coeff,int width,int height,uint8_t *levels)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  undefined8 *puVar7;
  void *in_RCX;
  int in_EDX;
  int iVar8;
  longlong in_RSI;
  void *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar9 [16];
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  __m128i alVar12;
  __m128i v;
  __m128i v_00;
  __m128i absABCD;
  __m128i absCD;
  __m128i absAB_2;
  __m128i coeffCD;
  __m128i coeffAB_2;
  __m128i coeffD;
  __m128i coeffC;
  __m128i coeffB_2;
  __m128i coeffA_2;
  int j;
  __m128i absAB8_1;
  __m128i absAB_1;
  __m128i coeffAB_1;
  __m128i coeffB_1;
  __m128i coeffA_1;
  __m128i lsAB;
  __m128i absAB8;
  __m128i absAB;
  __m128i coeffAB;
  __m128i coeffB;
  __m128i coeffA;
  tran_low_t *cf;
  uint8_t *ls;
  int i;
  uint8_t *bottom_buf_end;
  uint8_t *bottom_buf;
  int32_t bottom_len;
  __m128i zeros;
  int stride;
  int local_28c;
  void *local_1d8;
  void *local_1d0;
  int local_1c4;
  undefined8 *local_1b8;
  
  iVar8 = (int)in_RSI;
  iVar6 = in_EDX + 4;
  local_1b8 = (undefined8 *)((long)in_RCX + (long)(iVar6 * iVar8));
  puVar7 = (undefined8 *)((long)local_1b8 + (long)(iVar6 * 4));
  do {
    *local_1b8 = 0;
    local_1b8[1] = 0;
    local_1b8 = local_1b8 + 2;
  } while (local_1b8 < puVar7);
  local_1c4 = 0;
  local_1d8 = in_RDI;
  local_1d0 = in_RCX;
  if (in_EDX == 4) {
    do {
      xx_loadu_128(local_1d8);
      alVar12 = xx_loadu_128((void *)((long)local_1d8 + 0x10));
      v[1] = alVar12[1];
      auVar5._8_8_ = extraout_XMM0_Qb;
      auVar5._0_8_ = extraout_XMM0_Qa;
      auVar4._8_8_ = extraout_XMM0_Qb_00;
      auVar4._0_8_ = extraout_XMM0_Qa_00;
      auVar9 = packssdw(auVar5,auVar4);
      auVar9 = pabsw(auVar9,auVar9);
      packsswb(auVar9,ZEXT816(0));
      v[0] = in_RSI;
      xx_storeu_128(local_1d0,v);
      local_1d0 = (void *)((long)local_1d0 + (long)(iVar6 * 2));
      local_1d8 = (void *)((long)local_1d8 + 0x20);
      local_1c4 = local_1c4 + 2;
    } while (local_1c4 < iVar8);
  }
  else if (in_EDX == 8) {
    do {
      xx_loadu_128(local_1d8);
      alVar12 = xx_loadu_128((void *)((long)local_1d8 + 0x10));
      v_00[1] = alVar12[1];
      auVar3._8_8_ = extraout_XMM0_Qb_01;
      auVar3._0_8_ = extraout_XMM0_Qa_01;
      auVar2._8_8_ = extraout_XMM0_Qb_02;
      auVar2._0_8_ = extraout_XMM0_Qa_02;
      auVar9 = packssdw(auVar3,auVar2);
      auVar9 = pabsw(auVar9,auVar9);
      packsswb(auVar9,ZEXT816(0));
      v_00[0] = in_RSI;
      xx_storeu_128(local_1d0,v_00);
      local_1d0 = (void *)((long)local_1d0 + (long)iVar6);
      local_1d8 = (void *)((long)local_1d8 + 0x20);
      local_1c4 = local_1c4 + 1;
    } while (local_1c4 < iVar8);
  }
  else {
    do {
      local_28c = 0;
      do {
        xx_loadu_128(local_1d8);
        xx_loadu_128((void *)((long)local_1d8 + 0x10));
        xx_loadu_128((void *)((long)local_1d8 + 0x20));
        alVar12 = xx_loadu_128((void *)((long)local_1d8 + 0x30));
        auVar1._8_8_ = extraout_XMM0_Qb_03;
        auVar1._0_8_ = extraout_XMM0_Qa_03;
        auVar10._8_8_ = extraout_XMM0_Qb_04;
        auVar10._0_8_ = extraout_XMM0_Qa_04;
        auVar10 = packssdw(auVar1,auVar10);
        auVar11._8_8_ = extraout_XMM0_Qb_05;
        auVar11._0_8_ = extraout_XMM0_Qa_05;
        auVar9._8_8_ = extraout_XMM0_Qb_06;
        auVar9._0_8_ = extraout_XMM0_Qa_06;
        auVar9 = packssdw(auVar11,auVar9);
        auVar11 = pabsw(auVar10,auVar10);
        auVar9 = pabsw(auVar9,auVar9);
        packsswb(auVar11,auVar9);
        alVar12[0] = in_RSI;
        xx_storeu_128((void *)((long)local_1d0 + (long)local_28c),alVar12);
        local_28c = local_28c + 0x10;
        local_1d8 = (void *)((long)local_1d8 + 0x40);
      } while (local_28c < in_EDX);
      *(undefined4 *)((long)local_1d0 + (long)in_EDX) = 0;
      local_1d0 = (void *)((long)local_1d0 + (long)iVar6);
      local_1c4 = local_1c4 + 1;
    } while (local_1c4 < iVar8);
  }
  return;
}

Assistant:

void av1_txb_init_levels_sse4_1(const tran_low_t *const coeff, const int width,
                                const int height, uint8_t *const levels) {
  const int stride = height + TX_PAD_HOR;
  const __m128i zeros = _mm_setzero_si128();

  const int32_t bottom_len = sizeof(*levels) * (TX_PAD_BOTTOM * stride);
  uint8_t *bottom_buf = levels + stride * width;
  uint8_t *bottom_buf_end = bottom_buf + bottom_len;
  do {
    _mm_storeu_si128((__m128i *)(bottom_buf), zeros);
    bottom_buf += 16;
  } while (bottom_buf < bottom_buf_end);

  int i = 0;
  uint8_t *ls = levels;
  const tran_low_t *cf = coeff;
  if (height == 4) {
    do {
      const __m128i coeffA = xx_loadu_128(cf);
      const __m128i coeffB = xx_loadu_128(cf + 4);
      const __m128i coeffAB = _mm_packs_epi32(coeffA, coeffB);
      const __m128i absAB = _mm_abs_epi16(coeffAB);
      const __m128i absAB8 = _mm_packs_epi16(absAB, zeros);
      const __m128i lsAB = _mm_unpacklo_epi32(absAB8, zeros);
      xx_storeu_128(ls, lsAB);
      ls += (stride << 1);
      cf += (height << 1);
      i += 2;
    } while (i < width);
  } else if (height == 8) {
    do {
      const __m128i coeffA = xx_loadu_128(cf);
      const __m128i coeffB = xx_loadu_128(cf + 4);
      const __m128i coeffAB = _mm_packs_epi32(coeffA, coeffB);
      const __m128i absAB = _mm_abs_epi16(coeffAB);
      const __m128i absAB8 = _mm_packs_epi16(absAB, zeros);
      xx_storeu_128(ls, absAB8);
      ls += stride;
      cf += height;
      i += 1;
    } while (i < width);
  } else {
    do {
      int j = 0;
      do {
        const __m128i coeffA = xx_loadu_128(cf);
        const __m128i coeffB = xx_loadu_128(cf + 4);
        const __m128i coeffC = xx_loadu_128(cf + 8);
        const __m128i coeffD = xx_loadu_128(cf + 12);
        const __m128i coeffAB = _mm_packs_epi32(coeffA, coeffB);
        const __m128i coeffCD = _mm_packs_epi32(coeffC, coeffD);
        const __m128i absAB = _mm_abs_epi16(coeffAB);
        const __m128i absCD = _mm_abs_epi16(coeffCD);
        const __m128i absABCD = _mm_packs_epi16(absAB, absCD);
        xx_storeu_128(ls + j, absABCD);
        j += 16;
        cf += 16;
      } while (j < height);
      *(int32_t *)(ls + height) = 0;
      ls += stride;
      i += 1;
    } while (i < width);
  }
}